

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_normalize_weak(secp256k1_fe *r)

{
  long in_RDI;
  secp256k1_fe *in_stack_00000020;
  
  secp256k1_fe_verify(r);
  secp256k1_fe_impl_normalize_weak(in_stack_00000020);
  *(undefined4 *)(in_RDI + 0x28) = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize_weak(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize_weak(r);
    r->magnitude = 1;

    SECP256K1_FE_VERIFY(r);
}